

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O0

bool __thiscall
Js::BufferWriter::WriteArray<Js::CallSiteInfo>(BufferWriter *this,CallSiteInfo *data,size_t len)

{
  ulong sizeInBytes;
  bool bVar1;
  size_t size;
  size_t len_local;
  CallSiteInfo *data_local;
  BufferWriter *this_local;
  
  sizeInBytes = len * 0x10;
  bVar1 = sizeInBytes <= this->lengthLeft;
  if (bVar1) {
    memcpy_s(this->current,sizeInBytes,data,sizeInBytes);
    this->current = this->current + sizeInBytes;
    this->lengthLeft = this->lengthLeft + len * -0x10;
  }
  return bVar1;
}

Assistant:

bool WriteArray(__in_ecount(len) T * data, size_t len)
        {
            size_t size = sizeof(T) * len;
            if (lengthLeft < size)
            {
                return false;
            }
            memcpy_s(current, size, data, size);
            current += size;
            lengthLeft -= size;
            return true;
        }